

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynom.h
# Opt level: O1

Polynom<Complex> * __thiscall
Polynom<Complex>::operator%=(Polynom<Complex> *this,Polynom<Complex> *a)

{
  Polynom<Complex> temp;
  Matrix<Complex> MStack_48;
  Matrix<Complex> local_38;
  Matrix<Complex> local_28;
  
  operator/((Polynom<Complex> *)&local_28,this);
  operator*((Polynom<Complex> *)&local_38,(Polynom<Complex> *)&local_28);
  Matrix<Complex>::~Matrix(&local_28);
  operator-((Polynom<Complex> *)&MStack_48,this);
  Matrix<Complex>::~Matrix(&local_38);
  Matrix<Complex>::operator=(&this->m,&MStack_48);
  Matrix<Complex>::~Matrix(&MStack_48);
  return this;
}

Assistant:

inline Polynom &operator%=(const Polynom &a)
    {
        return *this = *this % a;
    }